

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DSAParameters.cpp
# Opt level: O0

bool __thiscall DSAParameters::deserialise(DSAParameters *this,ByteString *serialised)

{
  size_t sVar1;
  DSAParameters *this_00;
  ByteString *inP;
  ByteString dG;
  ByteString dQ;
  ByteString dP;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined1 local_1;
  
  ByteString::chainDeserialise
            ((ByteString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  ByteString::chainDeserialise
            ((ByteString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  ByteString::chainDeserialise
            ((ByteString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  sVar1 = ByteString::size((ByteString *)0x14e59e);
  if (sVar1 != 0) {
    this_00 = (DSAParameters *)ByteString::size((ByteString *)0x14e5ba);
    if (this_00 != (DSAParameters *)0x0) {
      inP = (ByteString *)ByteString::size((ByteString *)0x14e5d6);
      if (inP != (ByteString *)0x0) {
        setP(this_00,inP);
        setQ(this_00,inP);
        setG(this_00,inP);
        local_1 = true;
        goto LAB_0014e681;
      }
    }
  }
  local_1 = false;
LAB_0014e681:
  ByteString::~ByteString((ByteString *)0x14e68b);
  ByteString::~ByteString((ByteString *)0x14e695);
  ByteString::~ByteString((ByteString *)0x14e6a2);
  return local_1;
}

Assistant:

bool DSAParameters::deserialise(ByteString& serialised)
{
	ByteString dP = ByteString::chainDeserialise(serialised);
	ByteString dQ = ByteString::chainDeserialise(serialised);
	ByteString dG = ByteString::chainDeserialise(serialised);

	if ((dP.size() == 0) ||
	    (dQ.size() == 0) ||
	    (dG.size() == 0))
	{
		return false;
	}

	setP(dP);
	setQ(dQ);
	setG(dG);

	return true;
}